

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

void xe::removeChildren(set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                        *nodeSet,TestGroup *group)

{
  int iVar1;
  int iVar2;
  TestNodeType TVar3;
  TestGroup *local_28;
  TestNode *child;
  TestGroup *pTStack_18;
  int ndx;
  TestGroup *group_local;
  set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
  *nodeSet_local;
  
  child._4_4_ = 0;
  pTStack_18 = group;
  group_local = (TestGroup *)nodeSet;
  while( true ) {
    iVar1 = child._4_4_;
    iVar2 = TestGroup::getNumChildren(pTStack_18);
    if (iVar2 <= iVar1) break;
    local_28 = (TestGroup *)TestGroup::getChild(pTStack_18,child._4_4_);
    std::
    set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
    ::erase((set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
             *)group_local,(key_type *)&local_28);
    TVar3 = TestNode::getNodeType(&local_28->super_TestNode);
    if (TVar3 == TESTNODETYPE_GROUP) {
      removeChildren((set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                      *)group_local,local_28);
    }
    child._4_4_ = child._4_4_ + 1;
  }
  return;
}

Assistant:

static void removeChildren (std::set<const TestNode*>& nodeSet, const TestGroup* group)
{
	for (int ndx = 0; ndx < group->getNumChildren(); ndx++)
	{
		const TestNode* child = group->getChild(ndx);
		nodeSet.erase(child);

		if (child->getNodeType() == TESTNODETYPE_GROUP)
			removeChildren(nodeSet, static_cast<const TestGroup*>(child));
	}
}